

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O2

void recff_bit64_tobit(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  uint uVar2;
  
  TVar1 = crec_ct_tv(J,(CType *)(**(long **)&J[-1].penalty[0x3c].val + 0x108),0,*J->base,rd->argv);
  uVar2 = TVar1 >> 0x18 & 0x1f;
  if (4 < uVar2 - 0xf) {
    (J->fold).ins.field_0.ot = 0x5b13;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = (ushort)uVar2 | 0x260;
    TVar1 = lj_opt_fold(J);
  }
  *J->base = TVar1;
  return;
}

Assistant:

void LJ_FASTCALL recff_bit64_tobit(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef tr = crec_ct_tv(J, ctype_get(cts, CTID_INT64), 0,
		       J->base[0], &rd->argv[0]);
  if (!tref_isinteger(tr))
    tr = emitconv(tr, IRT_INT, tref_type(tr), 0);
  J->base[0] = tr;
}